

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumSerializers.hpp
# Opt level: O3

XMLNodeAdapter *
BSDFData::operator>>(XMLNodeAdapter *node,WavelengthDataDirection *wavelengthDataDirection)

{
  XMLNodeAdapter *pXVar1;
  function<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = WavelengthDataDirectionFromString;
  local_28._M_invoker =
       std::
       _Function_handler<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthDataDirection_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<BSDFData::WavelengthDataDirection_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::WavelengthDataDirection_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
       ::_M_manager;
  pXVar1 = FileParse::deserializeEnum<XMLNodeAdapter,BSDFData::WavelengthDataDirection>
                     (node,wavelengthDataDirection,&local_28);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return pXVar1;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::WavelengthDataDirection & wavelengthDataDirection)
    {
        return FileParse::deserializeEnum<NodeAdapter, WavelengthDataDirection>(
          node, wavelengthDataDirection, WavelengthDataDirectionFromString);
    }